

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::OFFImporter::InternReadFile
          (OFFImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  uint uVar2;
  IOStream *__p;
  pointer pIVar3;
  DeadlyImportError *pDVar4;
  reference pvVar5;
  size_type sVar6;
  aiMesh **ppaVar7;
  aiMesh *this_00;
  ulong *puVar8;
  ulong uVar9;
  aiVector3D *paVar10;
  Logger *pLVar11;
  aiColor4D *out;
  aiNode *this_01;
  uint *puVar12;
  aiMaterial **ppaVar13;
  aiMaterial *this_02;
  aiFace *paVar14;
  aiVector3t<float> *local_13e0;
  aiColor4D *local_13c8;
  aiColor4t<float> *local_13b0;
  aiVector3D *local_1390;
  aiVector3t<float> *local_1378;
  aiVector3t<float> *local_1348;
  aiFace *local_1320;
  int local_125c;
  undefined1 local_1258 [4];
  int twosided;
  aiColor4D clr;
  aiMaterial *pcMat;
  uint local_1238;
  uint m;
  uint idx;
  uint i_1;
  aiVector3D *t;
  aiColor4D *c;
  aiVector3D *n;
  float local_1210;
  uint dim_1;
  ai_real w;
  uint dim;
  ai_real *vec [3];
  aiVector3D *v;
  char **ppcStack_11e0;
  uint i;
  char *sz;
  char line [4096];
  aiFace *local_1a8;
  aiFace *faces;
  aiMesh *mesh;
  string local_190;
  undefined1 local_16a;
  allocator local_169;
  string local_168;
  uint local_144;
  uint local_140;
  uint numFaces;
  uint numVertices;
  undefined1 local_112;
  allocator local_111;
  string local_110;
  char *local_f0;
  char *end;
  char *car;
  byte local_d5;
  uint dimensions;
  bool hasDimension;
  bool hasHomogenous;
  bool hasColors;
  bool hasNormals;
  reference pvStack_d0;
  bool hasTexCoord;
  char *buffer;
  vector<char,_std::allocator<char>_> mBuffer2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  OFFImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar3 == (pointer)0x0) {
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open OFF file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar4,&local_88);
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&buffer);
  pIVar3 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  BaseImporter::TextFileToBuffer(pIVar3,(vector<char,_std::allocator<char>_> *)&buffer,FORBID_EMPTY)
  ;
  pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)&buffer,0);
  dimensions._3_1_ = 0;
  dimensions._2_1_ = 0;
  dimensions._1_1_ = 0;
  dimensions._0_1_ = 0;
  local_d5 = 0;
  car._4_4_ = 3;
  end = pvVar5;
  pvStack_d0 = pvVar5;
  sVar6 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)&buffer);
  local_f0 = pvVar5 + sVar6;
  NextToken(&end,local_f0);
  if (((end < local_f0 + -2) && (*end == 'S')) && (end[1] == 'T')) {
    dimensions._3_1_ = 1;
    end = end + 2;
  }
  if ((end < local_f0 + -1) && (*end == 'C')) {
    dimensions._1_1_ = 1;
    end = end + 1;
  }
  if ((end < local_f0 + -1) && (*end == 'N')) {
    dimensions._2_1_ = 1;
    end = end + 1;
  }
  if ((end < local_f0 + -1) && (*end == '4')) {
    dimensions._0_1_ = 1;
    end = end + 1;
  }
  if ((end < local_f0 + -1) && (*end == 'n')) {
    local_d5 = 1;
    end = end + 1;
  }
  if ((((end < local_f0 + -3) && (*end == 'O')) && (end[1] == 'F')) && (end[2] == 'F')) {
    end = end + 3;
    NextToken(&end,local_f0);
  }
  else {
    car._4_4_ = 3;
    dimensions._0_1_ = 0;
    NextToken(&end,local_f0);
    if (((local_f0 + -1 <= end) || (*end < '0')) || ('9' < *end)) {
      local_112 = 1;
      pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,"OFF: Header is invalid",&local_111);
      DeadlyImportError::DeadlyImportError(pDVar4,&local_110);
      local_112 = 0;
      __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  if ((local_d5 & 1) != 0) {
    car._4_4_ = strtoul10(end,&end);
    NextToken(&end,local_f0);
  }
  if (3 < car._4_4_) {
    numFaces._2_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&numVertices,"OFF: Number of vertex coordinates higher than 3 unsupported",
               (allocator *)((long)&numFaces + 3));
    DeadlyImportError::DeadlyImportError(pDVar4,(string *)&numVertices);
    numFaces._2_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  NextToken(&end,local_f0);
  local_140 = strtoul10(end,&end);
  NextToken(&end,local_f0);
  local_144 = strtoul10(end,&end);
  NextToken(&end,local_f0);
  strtoul10(end,&end);
  NextToken(&end,local_f0);
  if (local_140 == 0) {
    local_16a = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,"OFF: There are no valid vertices",&local_169)
    ;
    DeadlyImportError::DeadlyImportError(pDVar4,&local_168);
    local_16a = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (local_144 == 0) {
    mesh._6_1_ = 1;
    pDVar4 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_190,"OFF: There are no valid faces",(allocator *)((long)&mesh + 7));
    DeadlyImportError::DeadlyImportError(pDVar4,&local_190);
    mesh._6_1_ = 0;
    __cxa_throw(pDVar4,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pScene->mNumMeshes = 1;
  ppaVar7 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
  pScene->mMeshes = ppaVar7;
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  *pScene->mMeshes = this_00;
  this_00->mNumFaces = local_144;
  uVar9 = (ulong)this_00->mNumFaces;
  puVar8 = (ulong *)operator_new__(uVar9 << 4 | 8);
  *puVar8 = uVar9;
  paVar14 = (aiFace *)(puVar8 + 1);
  if (uVar9 != 0) {
    local_1320 = paVar14;
    do {
      aiFace::aiFace(local_1320);
      local_1320 = local_1320 + 1;
    } while (local_1320 != paVar14 + uVar9);
  }
  this_00->mFaces = paVar14;
  this_00->mNumVertices = local_140;
  uVar9 = (ulong)local_140;
  paVar10 = (aiVector3D *)operator_new__(uVar9 * 0xc);
  if (uVar9 != 0) {
    local_1348 = paVar10;
    do {
      aiVector3t<float>::aiVector3t(local_1348);
      local_1348 = local_1348 + 1;
    } while (local_1348 != paVar10 + uVar9);
  }
  this_00->mVertices = paVar10;
  if ((dimensions._2_1_ & 1) == 0) {
    local_1390 = (aiVector3D *)0x0;
  }
  else {
    uVar9 = (ulong)local_140;
    local_1390 = (aiVector3D *)operator_new__(uVar9 * 0xc);
    if (uVar9 != 0) {
      local_1378 = local_1390;
      do {
        aiVector3t<float>::aiVector3t(local_1378);
        local_1378 = local_1378 + 1;
      } while (local_1378 != local_1390 + uVar9);
    }
  }
  this_00->mNormals = local_1390;
  line[0xfff] = '\0';
  if ((dimensions._1_1_ & 1) == 0) {
    local_13c8 = (aiColor4D *)0x0;
  }
  else {
    uVar9 = (ulong)local_140;
    local_13c8 = (aiColor4D *)operator_new__(uVar9 << 4);
    line[0xfff] = '\x01';
    if (uVar9 != 0) {
      local_13b0 = local_13c8;
      do {
        aiColor4t<float>::aiColor4t(local_13b0);
        local_13b0 = local_13b0 + 1;
      } while (local_13b0 != local_13c8 + uVar9);
    }
  }
  this_00->mColors[0] = local_13c8;
  if ((dimensions._3_1_ & 1) != 0) {
    this_00->mNumUVComponents[0] = 2;
    uVar9 = (ulong)local_140;
    paVar10 = (aiVector3D *)operator_new__(uVar9 * 0xc);
    if (uVar9 != 0) {
      local_13e0 = paVar10;
      do {
        aiVector3t<float>::aiVector3t(local_13e0);
        local_13e0 = local_13e0 + 1;
      } while (local_13e0 != paVar10 + uVar9);
    }
    this_00->mTextureCoords[0] = paVar10;
  }
  pvStack_d0 = end;
  ppcStack_11e0 = (char **)end;
  for (v._4_4_ = 0; v._4_4_ < local_140; v._4_4_ = v._4_4_ + 1) {
    bVar1 = GetNextLine<char>(&stack0xffffffffffffff30,(char *)&sz);
    if (!bVar1) {
      pLVar11 = DefaultLogger::get();
      Logger::error(pLVar11,"OFF: The number of verts in the header is incorrect");
      break;
    }
    _w = this_00->mVertices + v._4_4_;
    ppcStack_11e0 = &sz;
    vec[0] = &_w->y;
    vec[1] = &_w->z;
    dim_1 = 0;
    vec[2] = &_w->x;
    for (; dim_1 < car._4_4_; dim_1 = dim_1 + 1) {
      SkipSpaces<char>((char **)&stack0xffffffffffffee20);
      ppcStack_11e0 =
           (char **)fast_atoreal_move<float>
                              ((char *)ppcStack_11e0,*(float **)(&w + (ulong)dim_1 * 2),true);
    }
    if (((byte)dimensions & 1) != 0) {
      SkipSpaces<char>((char **)&stack0xffffffffffffee20);
      local_1210 = 1.0;
      ppcStack_11e0 = (char **)fast_atoreal_move<float>((char *)ppcStack_11e0,&local_1210,true);
      for (n._4_4_ = 0; n._4_4_ < car._4_4_; n._4_4_ = n._4_4_ + 1) {
        **(float **)(&w + (ulong)n._4_4_ * 2) = **(float **)(&w + (ulong)n._4_4_ * 2) / local_1210;
      }
    }
    if ((dimensions._2_1_ & 1) != 0) {
      paVar10 = this_00->mNormals + v._4_4_;
      SkipSpaces<char>((char **)&stack0xffffffffffffee20);
      ppcStack_11e0 = (char **)fast_atoreal_move<float>((char *)ppcStack_11e0,&paVar10->x,true);
      SkipSpaces<char>((char **)&stack0xffffffffffffee20);
      ppcStack_11e0 = (char **)fast_atoreal_move<float>((char *)ppcStack_11e0,&paVar10->y,true);
      SkipSpaces<char>((char **)&stack0xffffffffffffee20);
      fast_atoreal_move<float>((char *)ppcStack_11e0,&paVar10->z,true);
    }
    if ((dimensions._1_1_ & 1) != 0) {
      out = this_00->mColors[0] + v._4_4_;
      SkipSpaces<char>((char **)&stack0xffffffffffffee20);
      ppcStack_11e0 = (char **)fast_atoreal_move<float>((char *)ppcStack_11e0,&out->r,true);
      if (((*(char *)ppcStack_11e0 == '#') || (*(char *)ppcStack_11e0 == '\n')) ||
         (*(char *)ppcStack_11e0 == '\r')) {
        out->g = 0.0;
      }
      else {
        SkipSpaces<char>((char **)&stack0xffffffffffffee20);
        ppcStack_11e0 = (char **)fast_atoreal_move<float>((char *)ppcStack_11e0,&out->g,true);
      }
      if (((*(char *)ppcStack_11e0 == '#') || (*(char *)ppcStack_11e0 == '\n')) ||
         (*(char *)ppcStack_11e0 == '\r')) {
        out->b = 0.0;
      }
      else {
        SkipSpaces<char>((char **)&stack0xffffffffffffee20);
        ppcStack_11e0 = (char **)fast_atoreal_move<float>((char *)ppcStack_11e0,&out->b,true);
      }
      if (((*(char *)ppcStack_11e0 == '#') || (*(char *)ppcStack_11e0 == '\n')) ||
         (*(char *)ppcStack_11e0 == '\r')) {
        out->a = 1.0;
      }
      else {
        SkipSpaces<char>((char **)&stack0xffffffffffffee20);
        ppcStack_11e0 = (char **)fast_atoreal_move<float>((char *)ppcStack_11e0,&out->a,true);
      }
    }
    if ((dimensions._3_1_ & 1) != 0) {
      paVar10 = this_00->mTextureCoords[0];
      SkipSpaces<char>((char **)&stack0xffffffffffffee20);
      ppcStack_11e0 =
           (char **)fast_atoreal_move<float>((char *)ppcStack_11e0,&paVar10[v._4_4_].x,true);
      SkipSpaces<char>((char **)&stack0xffffffffffffee20);
      fast_atoreal_move<float>((char *)ppcStack_11e0,&paVar10[v._4_4_].y,true);
    }
  }
  local_1a8 = this_00->mFaces;
  m = 0;
  do {
    if (local_144 <= m) {
LAB_00736e87:
      this_01 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_01);
      pScene->mRootNode = this_01;
      aiString::Set(&pScene->mRootNode->mName,"<OFFRoot>");
      pScene->mRootNode->mNumMeshes = 1;
      puVar12 = (uint *)operator_new__((ulong)pScene->mRootNode->mNumMeshes << 2);
      pScene->mRootNode->mMeshes = puVar12;
      *pScene->mRootNode->mMeshes = 0;
      pScene->mNumMaterials = 1;
      ppaVar13 = (aiMaterial **)operator_new__((ulong)pScene->mNumMaterials << 3);
      pScene->mMaterials = ppaVar13;
      this_02 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_02);
      clr._8_8_ = this_02;
      aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_1258,0.6,0.6,0.6,1.0);
      aiMaterial::AddProperty((aiMaterial *)clr._8_8_,(aiColor4D *)local_1258,1,"$clr.diffuse",0,0);
      *pScene->mMaterials = (aiMaterial *)clr._8_8_;
      local_125c = 1;
      aiMaterial::AddProperty((aiMaterial *)clr._8_8_,&local_125c,1,"$mat.twosided",0,0);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&buffer);
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_30);
      return;
    }
    bVar1 = GetNextLine<char>(&stack0xffffffffffffff30,(char *)&sz);
    if (!bVar1) {
      pLVar11 = DefaultLogger::get();
      Logger::error(pLVar11,"OFF: The number of faces in the header is incorrect");
      goto LAB_00736e87;
    }
    ppcStack_11e0 = &sz;
    SkipSpaces<char>((char **)&stack0xffffffffffffee20);
    uVar2 = strtoul10((char *)ppcStack_11e0,(char **)&stack0xffffffffffffee20);
    if ((uVar2 == 0) || (9 < uVar2)) {
      pLVar11 = DefaultLogger::get();
      Logger::error(pLVar11,"OFF: Faces with zero indices aren\'t allowed");
      this_00->mNumFaces = this_00->mNumFaces - 1;
    }
    else {
      local_1a8->mNumIndices = uVar2;
      puVar12 = (uint *)operator_new__((ulong)local_1a8->mNumIndices << 2);
      local_1a8->mIndices = puVar12;
      for (pcMat._4_4_ = 0; pcMat._4_4_ < local_1a8->mNumIndices; pcMat._4_4_ = pcMat._4_4_ + 1) {
        SkipSpaces<char>((char **)&stack0xffffffffffffee20);
        local_1238 = strtoul10((char *)ppcStack_11e0,(char **)&stack0xffffffffffffee20);
        if (local_140 <= local_1238) {
          pLVar11 = DefaultLogger::get();
          Logger::error(pLVar11,"OFF: Vertex index is out of range");
          local_1238 = local_140 - 1;
        }
        local_1a8->mIndices[pcMat._4_4_] = local_1238;
      }
      m = m + 1;
      local_1a8 = local_1a8 + 1;
    }
  } while( true );
}

Assistant:

void OFFImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open OFF file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // Proper OFF header parser. We only implement normal loading for now.
    bool hasTexCoord = false, hasNormals = false, hasColors = false;
    bool hasHomogenous = false, hasDimension = false;
    unsigned int dimensions = 3;
    const char* car = buffer;
    const char* end = buffer + mBuffer2.size();
    NextToken(&car, end);
    
    if (car < end - 2 && car[0] == 'S' && car[1] == 'T') {
      hasTexCoord = true; car += 2;
    }
    if (car < end - 1 && car[0] == 'C') {
      hasColors = true; car++;
    }
    if (car < end- 1 && car[0] == 'N') {
      hasNormals = true; car++;
    }
    if (car < end - 1 && car[0] == '4') {
      hasHomogenous = true; car++;
    }
    if (car < end - 1 && car[0] == 'n') {
      hasDimension = true; car++;
    }
    if (car < end - 3 && car[0] == 'O' && car[1] == 'F' && car[2] == 'F') {
        car += 3;
	NextToken(&car, end);
    } else {
      // in case there is no OFF header (which is allowed by the
      // specification...), then we might have unintentionally read an
      // additional dimension from the primitive count fields
      dimensions = 3;
      hasHomogenous = false;
      NextToken(&car, end);
      
      // at this point the next token should be an integer number
      if (car >= end - 1 || *car < '0' || *car > '9') {
	throw DeadlyImportError("OFF: Header is invalid");
      }
    }
    if (hasDimension) {
        dimensions = strtoul10(car, &car);
	NextToken(&car, end);
    }
    if (dimensions > 3) {
        throw DeadlyImportError
	  ("OFF: Number of vertex coordinates higher than 3 unsupported");
    }

    NextToken(&car, end);
    const unsigned int numVertices = strtoul10(car, &car);
    NextToken(&car, end);
    const unsigned int numFaces = strtoul10(car, &car);
    NextToken(&car, end);
    strtoul10(car, &car);  // skip edge count
    NextToken(&car, end);

    if (!numVertices) {
        throw DeadlyImportError("OFF: There are no valid vertices");
    }
    if (!numFaces) {
        throw DeadlyImportError("OFF: There are no valid faces");
    }

    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ];

    aiMesh* mesh = new aiMesh();
    pScene->mMeshes[0] = mesh;

    mesh->mNumFaces = numFaces;
    aiFace* faces = new aiFace[mesh->mNumFaces];
    mesh->mFaces = faces;

    mesh->mNumVertices = numVertices;
    mesh->mVertices = new aiVector3D[numVertices];
    mesh->mNormals = hasNormals ? new aiVector3D[numVertices] : nullptr;
    mesh->mColors[0] = hasColors ? new aiColor4D[numVertices] : nullptr;

    if (hasTexCoord) {
        mesh->mNumUVComponents[0] = 2;
        mesh->mTextureCoords[0] = new aiVector3D[numVertices];
    }
    char line[4096];
    buffer = car;
    const char *sz = car;

    // now read all vertex lines
    for (unsigned int i = 0; i < numVertices; ++i) {
        if(!GetNextLine(buffer, line)) {
            ASSIMP_LOG_ERROR("OFF: The number of verts in the header is incorrect");
            break;
        }
        aiVector3D& v = mesh->mVertices[i];	
        sz = line;

	// helper array to write a for loop over possible dimension values
	ai_real* vec[3] = {&v.x, &v.y, &v.z};

	// stop at dimensions: this allows loading 1D or 2D coordinate vertices
        for (unsigned int dim = 0; dim < dimensions; ++dim ) {
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz, *vec[dim]);
	}

	// if has homogenous coordinate, divide others by this one
	if (hasHomogenous) {
	    SkipSpaces(&sz);
	    ai_real w = 1.;
	    sz = fast_atoreal_move<ai_real>(sz, w);
            for (unsigned int dim = 0; dim < dimensions; ++dim ) {
	        *(vec[dim]) /= w;
	    }
	}

	// read optional normals
	if (hasNormals) {
	    aiVector3D& n = mesh->mNormals[i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)n.x);
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)n.y);
	    SkipSpaces(&sz);
	    fast_atoreal_move<ai_real>(sz,(ai_real&)n.z);
	}
	
	// reading colors is a pain because the specification says it can be
	// integers or floats, and any number of them between 1 and 4 included,
	// until the next comment or end of line
	// in theory should be testing type !
	if (hasColors) {
	    aiColor4D& c = mesh->mColors[0][i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.r);
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.g);
            } else {
	        c.g = 0.;
	    }
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.b);
            } else {
	        c.b = 0.;
	    }
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.a);
            } else {
	        c.a = 1.;
	    }
	}
        if (hasTexCoord) {
	    aiVector3D& t = mesh->mTextureCoords[0][i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)t.x);
	    SkipSpaces(&sz);
	    fast_atoreal_move<ai_real>(sz,(ai_real&)t.y);
	}
    }

    // load faces with their indices
    faces = mesh->mFaces;
    for (unsigned int i = 0; i < numFaces; ) {
        if(!GetNextLine(buffer,line)) {
            ASSIMP_LOG_ERROR("OFF: The number of faces in the header is incorrect");
            break;
        }
        unsigned int idx;
        sz = line; SkipSpaces(&sz);
        idx = strtoul10(sz,&sz);
        if(!idx || idx > 9) {
	    ASSIMP_LOG_ERROR("OFF: Faces with zero indices aren't allowed");
            --mesh->mNumFaces;
            continue;
	}
	faces->mNumIndices = idx;
        faces->mIndices = new unsigned int[faces->mNumIndices];
        for (unsigned int m = 0; m < faces->mNumIndices;++m) {
            SkipSpaces(&sz);
            idx = strtoul10(sz,&sz);
            if (idx >= numVertices) {
                ASSIMP_LOG_ERROR("OFF: Vertex index is out of range");
                idx = numVertices - 1;
            }
            faces->mIndices[m] = idx;
        }
        ++i;
        ++faces;
    }
    
    // generate the output node graph
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<OFFRoot>");
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int [pScene->mRootNode->mNumMeshes];
    pScene->mRootNode->mMeshes[0] = 0;

    // generate a default material
    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    aiMaterial* pcMat = new aiMaterial();

    aiColor4D clr( ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 1.0 ) );
    pcMat->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
    pScene->mMaterials[0] = pcMat;

    const int twosided = 1;
    pcMat->AddProperty(&twosided, 1, AI_MATKEY_TWOSIDED);
}